

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_table_column_metadata
              (sqlite3 *db,char *zDbName,char *zTableName,char *zColumnName,char **pzDataType,
              char **pzCollSeq,int *pNotNull,int *pPrimaryKey,int *pAutoinc)

{
  int iVar1;
  int iVar2;
  Table *pTVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  Column *pCVar11;
  long in_FS_OFFSET;
  bool bVar12;
  uint local_78;
  char *local_70;
  char *zErrMsg;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  zErrMsg = (char *)0x0;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  sqlite3BtreeEnterAll(db);
  iVar1 = sqlite3Init(db,&zErrMsg);
  if (iVar1 == 0) {
    pTVar3 = sqlite3FindTable(db,zTableName,zDbName);
    if ((pTVar3 != (Table *)0x0) && (pTVar3->eTabType != '\x02')) {
      uVar4 = 1;
      local_70 = "INTEGER";
      if (zColumnName == (char *)0x0) {
        pcVar5 = (char *)0x0;
        bVar12 = false;
        local_78 = 0;
      }
      else {
        uVar4 = (uint)pTVar3->nCol;
        lVar9 = 0;
        uVar7 = 0;
        if (0 < (int)uVar4) {
          uVar7 = (ulong)uVar4;
        }
        pCVar11 = (Column *)0x0;
        for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
          pCVar11 = pTVar3->aCol;
          iVar2 = sqlite3StrICmp(*(char **)((long)&pCVar11->zCnName + lVar9),zColumnName);
          if (iVar2 == 0) {
            pCVar11 = (Column *)((long)&pCVar11->zCnName + lVar9);
            uVar7 = uVar10 & 0xffffffff;
            break;
          }
          pCVar11 = (Column *)((long)&pCVar11->zCnName + lVar9);
          lVar9 = lVar9 + 0x10;
        }
        uVar6 = (uint)uVar7;
        if (uVar6 == uVar4) {
          if ((pTVar3->tabFlags & 0x80) == 0) {
            iVar2 = sqlite3IsRowid(zColumnName);
            if (iVar2 != 0) {
              uVar6 = (uint)pTVar3->iPKey;
              if (-1 < (int)uVar6) {
                pCVar11 = pTVar3->aCol + (ushort)pTVar3->iPKey;
                goto LAB_0012c2ab;
              }
              goto LAB_0012c2f8;
            }
          }
          goto LAB_0012c0bb;
        }
LAB_0012c2ab:
        if (pCVar11 == (Column *)0x0) {
LAB_0012c2f8:
          pcVar5 = (char *)0x0;
          bVar12 = false;
          local_78 = 0;
          uVar4 = 1;
        }
        else {
          local_78 = 0;
          local_70 = sqlite3ColumnType(pCVar11,(char *)0x0);
          pcVar5 = sqlite3ColumnColl(pCVar11);
          bVar12 = (pCVar11->field_0x8 & 0xf) != 0;
          uVar4 = pCVar11->colFlags & 1;
          if (uVar6 == (int)pTVar3->iPKey) {
            local_78 = pTVar3->tabFlags >> 3 & 1;
          }
        }
      }
      uVar6 = (uint)bVar12;
      pcVar8 = "BINARY";
      if (pcVar5 != (char *)0x0) {
        pcVar8 = pcVar5;
      }
      bVar12 = true;
      goto LAB_0012c0d8;
    }
  }
LAB_0012c0bb:
  bVar12 = false;
  local_70 = (char *)0x0;
  pcVar8 = (char *)0x0;
  uVar6 = 0;
  uVar4 = 0;
  local_78 = 0;
LAB_0012c0d8:
  sqlite3BtreeLeaveAll(db);
  if (pzDataType != (char **)0x0) {
    *pzDataType = local_70;
  }
  if (pzCollSeq != (char **)0x0) {
    *pzCollSeq = pcVar8;
  }
  if (pNotNull != (int *)0x0) {
    *pNotNull = uVar6;
  }
  if (pPrimaryKey != (int *)0x0) {
    *pPrimaryKey = uVar4;
  }
  if (pAutoinc != (int *)0x0) {
    *pAutoinc = local_78;
  }
  if (iVar1 == 0 && !bVar12) {
    sqlite3DbFree(db,zErrMsg);
    zErrMsg = sqlite3MPrintf(db,"no such table column: %s.%s",zTableName,zColumnName);
    iVar1 = 1;
  }
  pcVar5 = "%s";
  if (zErrMsg == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  sqlite3ErrorWithMsg(db,iVar1,pcVar5);
  sqlite3DbFree(db,zErrMsg);
  iVar1 = sqlite3ApiExit(db,iVar1);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API int sqlite3_table_column_metadata(
  sqlite3 *db,                /* Connection handle */
  const char *zDbName,        /* Database name or NULL */
  const char *zTableName,     /* Table name */
  const char *zColumnName,    /* Column name */
  char const **pzDataType,    /* OUTPUT: Declared data type */
  char const **pzCollSeq,     /* OUTPUT: Collation sequence name */
  int *pNotNull,              /* OUTPUT: True if NOT NULL constraint exists */
  int *pPrimaryKey,           /* OUTPUT: True if column part of PK */
  int *pAutoinc               /* OUTPUT: True if column is auto-increment */
){
  int rc;
  char *zErrMsg = 0;
  Table *pTab = 0;
  Column *pCol = 0;
  int iCol = 0;
  char const *zDataType = 0;
  char const *zCollSeq = 0;
  int notnull = 0;
  int primarykey = 0;
  int autoinc = 0;


#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTableName==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif

  /* Ensure the database schema has been loaded */
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  rc = sqlite3Init(db, &zErrMsg);
  if( SQLITE_OK!=rc ){
    goto error_out;
  }

  /* Locate the table in question */
  pTab = sqlite3FindTable(db, zTableName, zDbName);
  if( !pTab || IsView(pTab) ){
    pTab = 0;
    goto error_out;
  }

  /* Find the column for which info is requested */
  if( zColumnName==0 ){
    /* Query for existence of table only */
  }else{
    for(iCol=0; iCol<pTab->nCol; iCol++){
      pCol = &pTab->aCol[iCol];
      if( 0==sqlite3StrICmp(pCol->zCnName, zColumnName) ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      if( HasRowid(pTab) && sqlite3IsRowid(zColumnName) ){
        iCol = pTab->iPKey;
        pCol = iCol>=0 ? &pTab->aCol[iCol] : 0;
      }else{
        pTab = 0;
        goto error_out;
      }
    }
  }

  /* The following block stores the meta information that will be returned
  ** to the caller in local variables zDataType, zCollSeq, notnull, primarykey
  ** and autoinc. At this point there are two possibilities:
  **
  **     1. The specified column name was rowid", "oid" or "_rowid_"
  **        and there is no explicitly declared IPK column.
  **
  **     2. The table is not a view and the column name identified an
  **        explicitly declared column. Copy meta information from *pCol.
  */
  if( pCol ){
    zDataType = sqlite3ColumnType(pCol,0);
    zCollSeq = sqlite3ColumnColl(pCol);
    notnull = pCol->notNull!=0;
    primarykey  = (pCol->colFlags & COLFLAG_PRIMKEY)!=0;
    autoinc = pTab->iPKey==iCol && (pTab->tabFlags & TF_Autoincrement)!=0;
  }else{
    zDataType = "INTEGER";
    primarykey = 1;
  }
  if( !zCollSeq ){
    zCollSeq = sqlite3StrBINARY;
  }

error_out:
  sqlite3BtreeLeaveAll(db);

  /* Whether the function call succeeded or failed, set the output parameters
  ** to whatever their local counterparts contain. If an error did occur,
  ** this has the effect of zeroing all output parameters.
  */
  if( pzDataType ) *pzDataType = zDataType;
  if( pzCollSeq ) *pzCollSeq = zCollSeq;
  if( pNotNull ) *pNotNull = notnull;
  if( pPrimaryKey ) *pPrimaryKey = primarykey;
  if( pAutoinc ) *pAutoinc = autoinc;

  if( SQLITE_OK==rc && !pTab ){
    sqlite3DbFree(db, zErrMsg);
    zErrMsg = sqlite3MPrintf(db, "no such table column: %s.%s", zTableName,
        zColumnName);
    rc = SQLITE_ERROR;
  }
  sqlite3ErrorWithMsg(db, rc, (zErrMsg?"%s":0), zErrMsg);
  sqlite3DbFree(db, zErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}